

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall
gflags::FlagRegisterer::FlagRegisterer<double>
          (FlagRegisterer *this,char *name,char *help,char *filename,double *current_storage,
          double *defvalue_storage)

{
  FlagValue *this_00;
  FlagValue *this_01;
  FlagValue *defvalue;
  FlagValue *current;
  double *defvalue_storage_local;
  double *current_storage_local;
  char *filename_local;
  char *help_local;
  char *name_local;
  FlagRegisterer *this_local;
  
  this_00 = (FlagValue *)operator_new(0x10);
  anon_unknown_2::FlagValue::FlagValue<double>(this_00,current_storage,false);
  this_01 = (FlagValue *)operator_new(0x10);
  anon_unknown_2::FlagValue::FlagValue<double>(this_01,defvalue_storage,false);
  anon_unknown_2::RegisterCommandLineFlag(name,help,filename,this_00,this_01);
  return;
}

Assistant:

FlagRegisterer::FlagRegisterer(const char* name,
                               const char* help,
                               const char* filename,
                               FlagType* current_storage,
                               FlagType* defvalue_storage) {
  FlagValue* const current = new FlagValue(current_storage, false);
  FlagValue* const defvalue = new FlagValue(defvalue_storage, false);
  RegisterCommandLineFlag(name, help, filename, current, defvalue);
}